

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

string * __thiscall
argparse::details::
join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,details *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,string *separator)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  stringstream value;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this == first._M_current)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)asStack_1b8);
  }
  else {
    std::__cxx11::stringstream::stringstream(asStack_1b8);
    std::operator<<(local_1a8,(string *)this);
    for (pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20)
        ; pbVar2 != first._M_current; pbVar2 = pbVar2 + 1) {
      poVar1 = std::operator<<(local_1a8,(string *)last._M_current);
      std::operator<<(poVar1,(string *)pbVar2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(StrIt first, StrIt last, const std::string &separator) {
  if (first == last) {
    return "";
  }
  std::stringstream value;
  value << *first;
  ++first;
  while (first != last) {
    value << separator << *first;
    ++first;
  }
  return value.str();
}